

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O1

ValueHolder * __thiscall
testing::internal::
CheckedDowncastToActualType<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,std::allocator<testing::internal::TraceInfo>>>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
          (internal *this,ThreadLocalValueHolderBase *base)

{
  char *__s1;
  int iVar1;
  ValueHolder *pVVar2;
  ValueHolder *extraout_RAX;
  long *extraout_RDX;
  GTestLog local_14;
  
  if (this == (internal *)0x0) {
    __cxa_bad_typeid();
    (((SocketWriter *)this)->super_AbstractSocketWriter)._vptr_AbstractSocketWriter =
         (_func_int **)&PTR__SocketWriter_0014ec50;
    ((SocketWriter *)this)->sockfd_ = -1;
    (((SocketWriter *)this)->host_name_)._M_dataplus._M_p =
         (pointer)&(((SocketWriter *)this)->host_name_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&((SocketWriter *)this)->host_name_,base->_vptr_ThreadLocalValueHolderBase,
               (long)base[1]._vptr_ThreadLocalValueHolderBase +
               (long)base->_vptr_ThreadLocalValueHolderBase);
    (((SocketWriter *)this)->port_num_)._M_dataplus._M_p =
         (pointer)&(((SocketWriter *)this)->port_num_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&((SocketWriter *)this)->port_num_,*extraout_RDX,
               extraout_RDX[1] + *extraout_RDX);
    StreamingListener::SocketWriter::MakeConnection((SocketWriter *)this);
    return extraout_RAX;
  }
  __s1 = *(char **)(*(long *)(*(long *)this + -8) + 8);
  if (__s1 != "N7testing8internal11ThreadLocalISt6vectorINS0_9TraceInfoESaIS3_EEE11ValueHolderE") {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,
                     "N7testing8internal11ThreadLocalISt6vectorINS0_9TraceInfoESaIS3_EEE11ValueHolderE"
                    );
      if (iVar1 == 0) goto LAB_0013a3e6;
    }
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/third_party/gtest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x5ee);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ",0x33);
    GTestLog::~GTestLog(&local_14);
  }
LAB_0013a3e6:
  pVVar2 = (ValueHolder *)
           __dynamic_cast(this,&ThreadLocalValueHolderBase::typeinfo,
                          &ThreadLocal<std::vector<testing::internal::TraceInfo,std::allocator<testing::internal::TraceInfo>>>
                           ::ValueHolder::typeinfo,0);
  return pVVar2;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}